

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O1

void __thiscall duckdb_parquet::SizeStatistics::~SizeStatistics(SizeStatistics *this)

{
  ~SizeStatistics(this,&VTT);
  operator_delete(this);
  return;
}

Assistant:

SizeStatistics::~SizeStatistics() noexcept {
}